

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O1

EvictionResult * __thiscall
duckdb::BufferPool::EvictBlocks
          (EvictionResult *__return_storage_ptr__,BufferPool *this,MemoryTag tag,idx_t extra_memory,
          idx_t memory_limit,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *buffer)

{
  unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true> *puVar1;
  bool bVar2;
  type pEVar3;
  reference this_00;
  type pEVar4;
  InternalException *this_01;
  unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true> *this_02;
  bool bVar5;
  bool bVar6;
  string local_50;
  
  this_02 = (this->queues).
            super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->queues).
           super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = this_02 == puVar1;
  if (!bVar5) {
    do {
      pEVar3 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>::
               operator*(this_02);
      (*this->_vptr_BufferPool[4])
                (__return_storage_ptr__,this,pEVar3,(ulong)tag,extra_memory,memory_limit,buffer);
      if (__return_storage_ptr__->success == false) {
        pEVar3 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>
                 ::operator*(this_02);
        this_00 = vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_true>
                  ::back(&this->queues);
        pEVar4 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>
                 ::operator*(this_00);
        bVar6 = pEVar3 == pEVar4;
        bVar2 = !bVar6;
      }
      else {
        bVar6 = true;
        bVar2 = false;
      }
      if (!bVar6) {
        TempBufferPoolReservation::~TempBufferPoolReservation(&__return_storage_ptr__->reservation);
      }
      if (!bVar2) {
        if (!bVar5) {
          return __return_storage_ptr__;
        }
        break;
      }
      this_02 = this_02 + 1;
      bVar5 = this_02 == puVar1;
    } while (!bVar5);
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Exited BufferPool::EvictBlocksInternal without obtaining BufferPool::EvictionResult",
             "");
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BufferPool::EvictionResult BufferPool::EvictBlocks(MemoryTag tag, idx_t extra_memory, idx_t memory_limit,
                                                   unique_ptr<FileBuffer> *buffer) {
	for (auto &queue : queues) {
		auto block_result = EvictBlocksInternal(*queue, tag, extra_memory, memory_limit, buffer);
		if (block_result.success || RefersToSameObject(*queue, *queues.back())) {
			return block_result; // Return upon success or upon last queue
		}
	}
	// This can never happen since we always return when i == 1. Exception to silence compiler warning
	throw InternalException("Exited BufferPool::EvictBlocksInternal without obtaining BufferPool::EvictionResult");
}